

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

upb_MessageValue jsondec_nonenum(jsondec *d,upb_FieldDef *f)

{
  upb_CType uVar1;
  upb_FieldDef *f_local;
  jsondec *d_local;
  
  uVar1 = upb_FieldDef_CType(f);
  switch(uVar1) {
  case kUpb_CType_Bool:
    _d_local = jsondec_bool(d,f);
    break;
  case kUpb_CType_Float:
  case kUpb_CType_Double:
    _d_local = jsondec_double(d,f);
    break;
  case kUpb_CType_Int32:
  case kUpb_CType_Int64:
    _d_local = jsondec_int(d,f);
    break;
  case kUpb_CType_UInt32:
  case kUpb_CType_UInt64:
    _d_local = jsondec_uint(d,f);
    break;
  case kUpb_CType_Enum:
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/json/decode.c"
                  ,0x410,"upb_MessageValue jsondec_nonenum(jsondec *, const upb_FieldDef *)");
  case kUpb_CType_Message:
    _d_local = jsondec_msg(d,f);
    break;
  case kUpb_CType_String:
  case kUpb_CType_Bytes:
    _d_local = jsondec_strfield(d,f);
  }
  return _d_local;
}

Assistant:

static upb_MessageValue jsondec_nonenum(jsondec* d, const upb_FieldDef* f) {
  switch (upb_FieldDef_CType(f)) {
    case kUpb_CType_Bool:
      return jsondec_bool(d, f);
    case kUpb_CType_Float:
    case kUpb_CType_Double:
      return jsondec_double(d, f);
    case kUpb_CType_UInt32:
    case kUpb_CType_UInt64:
      return jsondec_uint(d, f);
    case kUpb_CType_Int32:
    case kUpb_CType_Int64:
      return jsondec_int(d, f);
    case kUpb_CType_String:
    case kUpb_CType_Bytes:
      return jsondec_strfield(d, f);
    case kUpb_CType_Message:
      return jsondec_msg(d, f);
    case kUpb_CType_Enum:
    default:
      UPB_UNREACHABLE();
  }
}